

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O2

void deqp::gles3::Functional::evalTexture2DShadow(ShaderEvalContext *c,TexLookupParams *p)

{
  float fVar1;
  
  fVar1 = texture2DShadow(c,c->in[0].m_data[2],c->in[0].m_data[0],c->in[0].m_data[1],p->lod);
  (c->color).m_data[0] = fVar1;
  return;
}

Assistant:

static void		evalTexture2DShadow				(gls::ShaderEvalContext& c, const TexLookupParams& p)	{ c.color.x() = texture2DShadow(c, c.in[0].z(), c.in[0].x(), c.in[0].y(), p.lod); }